

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

QMetaCallEvent *
QMetaCallEvent::create_impl
          (SlotObjUniquePtr *slotObj,QObject *sender,int signal_index,size_t argc,void **argp,
          QMetaType *metaTypes)

{
  pointer pQVar1;
  void **ppvVar2;
  QMetaType *this;
  void *pvVar3;
  void *in_RCX;
  long in_R9;
  long in_FS_OFFSET;
  size_t i;
  QMetaType *types;
  void **args;
  __single_object metaCallEvent;
  unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_> *this_00;
  int *in_stack_ffffffffffffff90;
  void *copy;
  int *in_stack_ffffffffffffff98;
  QObject **in_stack_ffffffffffffffa0;
  unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
  *in_stack_ffffffffffffffa8;
  unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_> local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20[0]._M_t.super___uniq_ptr_impl<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_>._M_t.
  super__Tuple_impl<0UL,_QMetaCallEvent_*,_std::default_delete<QMetaCallEvent>_>.
  super__Head_base<0UL,_QMetaCallEvent_*,_false>._M_head_impl =
       (__uniq_ptr_data<QMetaCallEvent,_std::default_delete<QMetaCallEvent>,_true,_true>)
       &DAT_aaaaaaaaaaaaaaaa;
  std::
  make_unique<QMetaCallEvent,std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>,QObject_const*&,int&,int>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff90);
  pQVar1 = std::unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_>::operator->
                     ((unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_> *)0x3ebe26);
  ppvVar2 = QMetaCallEvent::args(pQVar1);
  pQVar1 = std::unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_>::operator->
                     ((unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_> *)0x3ebe4c);
  this = QMetaCallEvent::types(pQVar1);
  copy = (void *)0x0;
  do {
    if (in_RCX <= copy) {
      this_00 = local_20;
      pQVar1 = std::unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_>::release
                         ((unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_> *)
                          0x3ebf51);
      std::unique_ptr<QMetaCallEvent,_std::default_delete<QMetaCallEvent>_>::~unique_ptr(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return pQVar1;
      }
LAB_003ebfab:
      __stack_chk_fail();
    }
    this[(long)copy].d_ptr = *(QMetaTypeInterface **)(in_R9 + (long)copy * 8);
    pvVar3 = QMetaType::create(this,copy);
    ppvVar2[(long)copy] = pvVar3;
    if ((copy != (void *)0x0) && (ppvVar2[(long)copy] == (void *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        qBadAlloc();
      }
      goto LAB_003ebfab;
    }
    copy = (void *)((long)copy + 1);
  } while( true );
}

Assistant:

QMetaCallEvent* QMetaCallEvent::create_impl(QtPrivate::SlotObjUniquePtr slotObj,
                                            const QObject *sender, int signal_index,
                                            size_t argc, const void* const argp[],
                                            const QMetaType metaTypes[])
{
    auto metaCallEvent = std::make_unique<QMetaCallEvent>(std::move(slotObj), sender,
                                                          signal_index, int(argc));

    void **args = metaCallEvent->args();
    QMetaType *types = metaCallEvent->types();
    for (size_t i = 0; i < argc; ++i) {
        types[i] = metaTypes[i];
        args[i] = types[i].create(argp[i]);
        Q_CHECK_PTR(!i || args[i]);
    }

    return metaCallEvent.release();
}